

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

bool __thiscall
ddd::DaTrie<true,_true,_false>::is_target_(DaTrie<true,_true,_false> *this,uint32_t base,Edge *edge)

{
  Bc BVar1;
  long lVar2;
  bool bVar3;
  
  if (edge->size_ == 0) {
    __assert_fail("0 < edge.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x3b7,
                  "bool ddd::DaTrie<true, true, false>::is_target_(uint32_t, const Edge &) const [WithBLM = true, WithNLM = true, Prefix = false]"
                 );
  }
  lVar2 = 0;
  do {
    BVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
            super__Vector_impl_data._M_start[edge->labels_[lVar2] ^ base];
    if ((long)BVar1 < 0) break;
    bVar3 = edge->size_ - 1 != lVar2;
    lVar2 = lVar2 + 1;
  } while (bVar3);
  return -1 < (long)BVar1;
}

Assistant:

bool is_target_(uint32_t base, const Edge& edge) const {
    assert(0 < edge.size());

    for (auto label : edge) {
      auto child_pos = base ^label;
      if (bc_[child_pos].is_fixed()) {
        return false;
      }
    }
    return true;
  }